

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

void ssl_handshake_wrapup_free_hs_transform(mbedtls_ssl_context *ssl)

{
  mbedtls_debug_print_msg
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x12e9,"=> handshake wrapup: final free");
  mbedtls_ssl_handshake_free(ssl->handshake);
  free(ssl->handshake);
  ssl->handshake = (mbedtls_ssl_handshake_params *)0x0;
  if (ssl->transform != (mbedtls_ssl_transform *)0x0) {
    mbedtls_ssl_transform_free(ssl->transform);
    free(ssl->transform);
  }
  ssl->transform = ssl->transform_negotiate;
  ssl->transform_negotiate = (mbedtls_ssl_transform *)0x0;
  mbedtls_debug_print_msg
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x12fd,"<= handshake wrapup: final free");
  return;
}

Assistant:

static void ssl_handshake_wrapup_free_hs_transform( mbedtls_ssl_context *ssl )
{
    MBEDTLS_SSL_DEBUG_MSG( 3, ( "=> handshake wrapup: final free" ) );

    /*
     * Free our handshake params
     */
    mbedtls_ssl_handshake_free( ssl->handshake );
    mbedtls_free( ssl->handshake );
    ssl->handshake = NULL;

    /*
     * Free the previous transform and swith in the current one
     */
    if( ssl->transform )
    {
        mbedtls_ssl_transform_free( ssl->transform );
        mbedtls_free( ssl->transform );
    }
    ssl->transform = ssl->transform_negotiate;
    ssl->transform_negotiate = NULL;

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "<= handshake wrapup: final free" ) );
}